

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  int iVar4;
  Verbosity VVar5;
  int *piVar6;
  cpp_dec_float<50U,_int,_void> *this_00;
  SPxOut *i_00;
  cpp_dec_float<50U,_int,_void> *this_01;
  long in_RDI;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Status stat;
  int i;
  int sparsitythreshold;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  Desc *ds;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  undefined4 in_stack_fffffffffffffc78;
  Status in_stack_fffffffffffffc7c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc80;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffca0;
  int local_330;
  int local_32c;
  undefined1 local_328 [40];
  double in_stack_fffffffffffffd00;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffd08;
  undefined1 local_2f0 [56];
  int local_2b8;
  int local_2b4;
  streamsize local_2b0;
  undefined4 local_2a8;
  Verbosity local_2a4;
  undefined1 local_2a0 [24];
  Status in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd80;
  undefined4 local_268;
  Verbosity local_264;
  undefined1 local_260 [56];
  undefined1 local_228 [56];
  undefined8 local_1f0;
  Status local_1e4;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [56];
  int local_1a0;
  undefined4 local_19c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  Desc *local_160;
  undefined8 local_150;
  int *local_148;
  undefined1 *local_140;
  undefined4 *local_138;
  long local_130;
  undefined1 *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined4 *local_118;
  int *local_110;
  undefined8 *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined8 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_160 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x1f0));
  leavetol(in_stack_fffffffffffffc98);
  *(undefined1 *)(in_RDI + 0x530) = 1;
  local_19c = 0;
  local_130 = in_RDI + 0x4f8;
  local_138 = &local_19c;
  local_118 = local_138;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  IdxSet::clear((IdxSet *)(in_RDI + 0xc98));
  local_1dc = coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x35eb18);
  local_70 = local_1d8;
  local_80 = &local_1dc;
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x6fc);
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x6fc));
  local_68 = local_1d8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80);
  local_50 = local_1d8;
  local_58 = local_78;
  local_60 = local_80;
  local_90 = (long)*local_80;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),(longlong *)0x35ebe0);
  local_1a0 = boost::multiprecision::number::operator_cast_to_int
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x35ebed);
  for (local_1e0 = 0; iVar4 = local_1e0,
      iVar3 = coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x35ec14), iVar4 < iVar3; local_1e0 = local_1e0 + 1) {
    local_1e4 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Desc::status((Desc *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    bVar1 = isBasic(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    if (bVar1) {
      local_1f0 = 0;
      local_100 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      local_108 = &local_1f0;
      local_f8 = local_108;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      if (*(int *)(in_RDI + 0xd38) == 0) {
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xd10),local_1e0);
        *piVar6 = 0;
      }
    }
    else {
      test(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78);
      local_120 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      local_128 = local_228;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      if (*(int *)(in_RDI + 0xd38) == 0) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_b0 = local_260;
        local_b8 = &local_198;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b8);
        local_a0 = local_260;
        local_a8 = local_b8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_98 = local_260;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x35ee1a);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffca0,(self_type *)in_stack_fffffffffffffc98);
          DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xd10),local_1e0);
          *piVar6 = 1;
          *(int *)(in_RDI + 0x534) = *(int *)(in_RDI + 0x534) + 1;
        }
        else {
          piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xd10),local_1e0);
          *piVar6 = 0;
        }
        iVar4 = IdxSet::size((IdxSet *)(in_RDI + 0xc98));
        if (local_1a0 < iVar4) {
          if ((*(long *)(in_RDI + 0xda8) != 0) &&
             (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8)), 3 < (int)VVar5)) {
            local_264 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8));
            local_268 = 4;
            (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_268)
            ;
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffc80,
                               (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffc80,
                               (_func_ostream_ptr_ostream_ptr *)
                               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
            (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_264)
            ;
          }
          *(undefined4 *)(in_RDI + 0xd38) = 5;
          *(undefined1 *)(in_RDI + 0xd2a) = 0;
          IdxSet::clear((IdxSet *)(in_RDI + 0xc98));
        }
      }
      else {
        in_stack_fffffffffffffca0 =
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_e0 = local_2a0;
        local_e8 = &local_198;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_e9,local_e8);
        local_d0 = local_2a0;
        local_d8 = local_e8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_c8 = local_2a0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x35f069);
        if (tVar2) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffca0,(self_type *)in_stack_fffffffffffffc98);
          *(int *)(in_RDI + 0x534) = *(int *)(in_RDI + 0x534) + 1;
        }
      }
    }
  }
  iVar4 = IdxSet::size((IdxSet *)(in_RDI + 0xc98));
  if ((iVar4 == 0) && ((*(byte *)(in_RDI + 0xd2a) & 1) == 0)) {
    *(int *)(in_RDI + 0xd38) = *(int *)(in_RDI + 0xd38) + -1;
  }
  else {
    iVar4 = IdxSet::size((IdxSet *)(in_RDI + 0xc98));
    if ((iVar4 <= local_1a0) && ((*(byte *)(in_RDI + 0xd2a) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0xda8) != 0) &&
         (VVar5 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8)), 3 < (int)VVar5)) {
        local_2a4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0xda8));
        local_2a8 = 4;
        (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_2a8);
        local_2b0 = SPxOut::precision((SPxOut *)0x35f1bb);
        if ((*(byte *)(in_RDI + 0xd2c) & 1) == 0) {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffc80,
                             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        }
        else {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffc80,
                             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        }
        this_00 = (cpp_dec_float<50U,_int,_void> *)
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc80,
                                     (char *)CONCAT44(in_stack_fffffffffffffc7c,
                                                      in_stack_fffffffffffffc78));
        local_2b4 = (int)std::setw(6);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (_Setw)(int)((ulong)this_00 >> 0x20));
        i_00 = soplex::operator<<((SPxOut *)this_00,
                                  (_func_ios_base_ptr_ios_base_ptr *)
                                  CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_2b8 = (int)std::setprecision(4);
        this_01 = (cpp_dec_float<50U,_int,_void> *)
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                                     (_Setprecision)(int)((ulong)this_00 >> 0x20));
        local_32c = IdxSet::size((IdxSet *)(in_RDI + 0xc98));
        local_140 = local_328;
        local_148 = &local_32c;
        local_150 = 0;
        local_110 = local_148;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (this_01,(longlong)i_00,this_00);
        local_330 = coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x35f2f1);
        local_28 = local_2f0;
        local_30 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_328;
        local_38 = &local_330;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_2f0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
        local_8 = local_2f0;
        local_10 = local_30;
        local_18 = local_38;
        local_48 = (long)*local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (this_00,(cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                   (longlong *)0x35f3b1);
        soplex::operator<<((SPxOut *)this_00,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        soplex::operator<<((SPxOut *)this_00,
                           (_func_ios_base_ptr_ios_base_ptr *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        std::setprecision((int)local_2b0);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (_Setprecision)(int)((ulong)this_00 >> 0x20));
        soplex::operator<<((SPxOut *)this_00,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        (**(code **)(**(long **)(in_RDI + 0xda8) + 0x10))(*(long **)(in_RDI + 0xda8),&local_2a4);
      }
      *(undefined1 *)(in_RDI + 0xd2a) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}